

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportwriter.cpp
# Opt level: O0

void __thiscall ReportWriter::writeSavedResults(ReportWriter *this,OutputFile *outFile)

{
  int iVar1;
  int iVar2;
  Node *node_00;
  Link *link_00;
  bool bVar3;
  int iVar4;
  void *pvVar5;
  ostream *poVar6;
  vector<Node_*,_std::allocator<Node_*>_> *this_00;
  reference ppNVar7;
  vector<Link_*,_std::allocator<Link_*>_> *this_01;
  reference ppLVar8;
  Link *link;
  iterator __end3_1;
  iterator __begin3_1;
  vector<Link_*,_std::allocator<Link_*>_> *__range3_1;
  Node *node;
  iterator __end3;
  iterator __begin3;
  vector<Node_*,_std::allocator<Node_*>_> *__range3;
  Utilities local_48 [8];
  string theTime;
  int local_28;
  int local_24;
  int i;
  int t;
  int reportStep;
  int nPeriods;
  OutputFile *outFile_local;
  ReportWriter *this_local;
  
  iVar1 = outFile->timePeriodCount;
  iVar2 = outFile->reportStep;
  OutputFile::seekNetworkOffset(outFile);
  local_24 = outFile->reportStart;
  for (local_28 = 1; local_28 <= iVar1; local_28 = local_28 + 1) {
    Utilities::getTime_abi_cxx11_(local_48,local_24);
    iVar4 = Network::option(this->network,REPORT_NODES);
    if (iVar4 == 0) {
      OutputFile::skipNodeResults(outFile);
    }
    else {
      std::ostream::operator<<(this->sout,std::left);
      pvVar5 = (void *)std::ostream::operator<<(this->sout,std::endl<char,std::char_traits<char>>);
      poVar6 = (ostream *)std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<(poVar6,"  Node Results at ");
      poVar6 = std::operator<<(poVar6,(string *)local_48);
      poVar6 = std::operator<<(poVar6," hrs");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      writeNodeHeader(this);
      this_00 = &this->network->nodes;
      __end3 = std::vector<Node_*,_std::allocator<Node_*>_>::begin(this_00);
      node = (Node *)std::vector<Node_*,_std::allocator<Node_*>_>::end(this_00);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                         *)&node), bVar3) {
        ppNVar7 = __gnu_cxx::
                  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                  operator*(&__end3);
        node_00 = *ppNVar7;
        OutputFile::readNodeResults(outFile);
        writeNodeResults(this,node_00,outFile->nodeResults);
        __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
        operator++(&__end3);
      }
    }
    iVar4 = Network::option(this->network,REPORT_LINKS);
    if (iVar4 == 0) {
      OutputFile::skipLinkResults(outFile);
    }
    else {
      std::ostream::operator<<(this->sout,std::left);
      pvVar5 = (void *)std::ostream::operator<<(this->sout,std::endl<char,std::char_traits<char>>);
      poVar6 = (ostream *)std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<(poVar6,"  Link Results at ");
      poVar6 = std::operator<<(poVar6,(string *)local_48);
      poVar6 = std::operator<<(poVar6," hrs");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      writeLinkHeader(this);
      this_01 = &this->network->links;
      __end3_1 = std::vector<Link_*,_std::allocator<Link_*>_>::begin(this_01);
      link = (Link *)std::vector<Link_*,_std::allocator<Link_*>_>::end(this_01);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<Link_**,_std::vector<Link_*,_std::allocator<Link_*>_>_>
                                 *)&link), bVar3) {
        ppLVar8 = __gnu_cxx::
                  __normal_iterator<Link_**,_std::vector<Link_*,_std::allocator<Link_*>_>_>::
                  operator*(&__end3_1);
        link_00 = *ppLVar8;
        OutputFile::readLinkResults(outFile);
        writeLinkResults(this,link_00,outFile->linkResults);
        __gnu_cxx::__normal_iterator<Link_**,_std::vector<Link_*,_std::allocator<Link_*>_>_>::
        operator++(&__end3_1);
      }
    }
    local_24 = iVar2 + local_24;
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void ReportWriter::writeSavedResults(OutputFile* outFile)
{
    int nPeriods = outFile->timePeriodCount;
    int reportStep = outFile->reportStep;
    outFile->seekNetworkOffset();
    int t = outFile->reportStart;
    for (int i = 1; i <= nPeriods; i++)
    {
        string theTime = Utilities::getTime(t);

        if (network->option(Options::REPORT_NODES))
        {
            sout << left;
            sout << endl << endl << "  Node Results at " << theTime << " hrs" << endl;
            writeNodeHeader();
            for (Node* node : network->nodes)
            {
                outFile->readNodeResults();
                writeNodeResults(node, outFile->nodeResults);
            }
        }
        else outFile->skipNodeResults();

        if (network->option(Options::REPORT_LINKS))
        {
            sout << left;
            sout << endl << endl << "  Link Results at " << theTime << " hrs" << endl;
            writeLinkHeader();
            for (Link* link : network->links)
            {
                outFile->readLinkResults();
                writeLinkResults(link, outFile->linkResults);
            }
        }
        else outFile->skipLinkResults();

        t += reportStep;
    }
}